

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O3

void __thiscall
vkb::detail::GenericFeatureChain::add<VkPhysicalDeviceVulkan12Features>
          (GenericFeatureChain *this,VkPhysicalDeviceVulkan12Features *features)

{
  pointer *ppGVar1;
  pointer pGVar2;
  iterator __position;
  pointer this_00;
  GenericFeaturesPNextNode local_420;
  
  this_00 = (this->nodes).
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pGVar2) {
    do {
      if (features->sType == this_00->sType) {
        GenericFeaturesPNextNode::GenericFeaturesPNextNode<VkPhysicalDeviceVulkan12Features>
                  (&local_420,features);
        GenericFeaturesPNextNode::combine(this_00,&local_420);
        return;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pGVar2);
  }
  GenericFeaturesPNextNode::GenericFeaturesPNextNode<VkPhysicalDeviceVulkan12Features>
            (&local_420,features);
  __position._M_current =
       (this->nodes).
       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->nodes).
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::_M_realloc_insert<vkb::detail::GenericFeaturesPNextNode>(&this->nodes,__position,&local_420);
  }
  else {
    memcpy(__position._M_current,&local_420,0x410);
    ppGVar1 = &(this->nodes).
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }